

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O1

vm_tadsobj_hdr * vm_tadsobj_hdr::expand(CVmObjTads *self,vm_tadsobj_hdr *hdr)

{
  ushort uVar1;
  uint uVar2;
  vm_tadsobj_hdr *pvVar3;
  
  uVar1 = hdr->prop_entry_cnt;
  uVar2 = (uint)(uVar1 >> 1) + (uint)uVar1;
  if (uVar1 < 0x81) {
    uVar2 = (uint)uVar1 + (uint)uVar1;
  }
  pvVar3 = expand_to(self,hdr,(ulong)hdr->sc_cnt,(ulong)uVar2 & 0xffff);
  return pvVar3;
}

Assistant:

vm_tadsobj_hdr *vm_tadsobj_hdr::expand(VMG_ CVmObjTads *self,
                                       vm_tadsobj_hdr *hdr)
{
    unsigned short prop_cnt;

    /* 
     *   Move up to the next property count increment.  If we're not huge,
     *   simply double the current size.  If we're getting large, expand by
     *   50%.  
     */
    prop_cnt = hdr->prop_entry_cnt;
    if (prop_cnt <= 128)
        prop_cnt *= 2;
    else
        prop_cnt += prop_cnt/2;

    /* expand to the new size */
    return expand_to(vmg_ self, hdr, hdr->sc_cnt, prop_cnt);
}